

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O0

int mbedtls_pk_sign_ext(mbedtls_pk_type_t pk_type,mbedtls_pk_context *ctx,mbedtls_md_type_t md_alg,
                       uchar *hash,size_t hash_len,uchar *sig,size_t sig_size,size_t *sig_len,
                       _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  uchar *sig_local;
  size_t hash_len_local;
  uchar *hash_local;
  mbedtls_md_type_t md_alg_local;
  mbedtls_pk_context *ctx_local;
  mbedtls_pk_type_t pk_type_local;
  
  *sig_len = 0;
  if (ctx->pk_info == (mbedtls_pk_info_t *)0x0) {
    ctx_local._4_4_ = -16000;
  }
  else {
    iVar1 = mbedtls_pk_can_do(ctx,pk_type);
    if (iVar1 == 0) {
      ctx_local._4_4_ = -0x3f00;
    }
    else if (pk_type == MBEDTLS_PK_RSASSA_PSS) {
      ctx_local._4_4_ = -0x3980;
    }
    else {
      ctx_local._4_4_ = mbedtls_pk_sign(ctx,md_alg,hash,hash_len,sig,sig_size,sig_len,f_rng,p_rng);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_pk_sign_ext(mbedtls_pk_type_t pk_type,
                        mbedtls_pk_context *ctx,
                        mbedtls_md_type_t md_alg,
                        const unsigned char *hash, size_t hash_len,
                        unsigned char *sig, size_t sig_size, size_t *sig_len,
                        int (*f_rng)(void *, unsigned char *, size_t),
                        void *p_rng)
{
#if defined(MBEDTLS_RSA_C)
    psa_algorithm_t psa_md_alg;
#endif /* MBEDTLS_RSA_C */
    *sig_len = 0;

    if (ctx->pk_info == NULL) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    if (!mbedtls_pk_can_do(ctx, pk_type)) {
        return MBEDTLS_ERR_PK_TYPE_MISMATCH;
    }

    if (pk_type != MBEDTLS_PK_RSASSA_PSS) {
        return mbedtls_pk_sign(ctx, md_alg, hash, hash_len,
                               sig, sig_size, sig_len, f_rng, p_rng);
    }

#if defined(MBEDTLS_RSA_C)
    psa_md_alg = mbedtls_md_psa_alg_from_type(md_alg);
    if (psa_md_alg == 0) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    if (mbedtls_pk_get_type(ctx) == MBEDTLS_PK_OPAQUE) {
        psa_status_t status;

        status = psa_sign_hash(ctx->priv_id, PSA_ALG_RSA_PSS(psa_md_alg),
                               hash, hash_len,
                               sig, sig_size, sig_len);
        return PSA_PK_RSA_TO_MBEDTLS_ERR(status);
    }

    return mbedtls_pk_psa_rsa_sign_ext(PSA_ALG_RSA_PSS(psa_md_alg),
                                       ctx->pk_ctx, hash, hash_len,
                                       sig, sig_size, sig_len);
#else /* MBEDTLS_RSA_C */
    return MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE;
#endif /* !MBEDTLS_RSA_C */

}